

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_invocable.h
# Opt level: O2

void absl::lts_20250127::internal_any_invocable::
     RemoteInvoker<false,void,google::protobuf::compiler::cpp::(anonymous_namespace)::AccessorVerifier&,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::io::Printer::SourceLocation>
               (TypeErasedState *state,ForwardedParameterType<std::basic_string_view<char>_> args,
               ForwardedParameterType<google::protobuf::io::Printer::SourceLocation> args_1)

{
  AccessorVerifier *pAVar1;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view text;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar2;
  undefined8 uVar3;
  AccessorVerifier *pAVar4;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  string_view prefix;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  
  pAVar1 = (AccessorVerifier *)(state->remote).target;
  __x_00 = *args;
  text._M_len = args->_M_len;
  text._M_str = args->_M_str;
  __x = *args;
  __y._M_str = "name";
  __y._M_len = 4;
  bVar2 = std::operator==(*args,__y);
  if ((bVar2) ||
     (__y_00._M_str = "release_name", __y_00._M_len = 0xc, bVar2 = std::operator==(__x,__y_00),
     bVar2)) {
    google::protobuf::compiler::cpp::anon_unknown_0::AccessorVerifier::SetTracker(pAVar1,pAVar1,1);
    pAVar4 = (AccessorVerifier *)&pAVar1->needs_weak_descriptor_pin_;
    uVar3 = 1;
  }
  else {
    prefix._M_str = "annotate";
    prefix._M_len = 8;
    bVar2 = StartsWith(text,prefix);
    pAVar4 = pAVar1;
    if (!bVar2) {
      __y_01._M_str = "WeakDescriptorSelfPin";
      __y_01._M_len = 0x15;
      bVar2 = std::operator==(__x_00,__y_01);
      if (!bVar2) {
        return;
      }
      pAVar4 = (AccessorVerifier *)&pAVar1->needs_weak_descriptor_pin_;
    }
    uVar3 = 0;
  }
  google::protobuf::compiler::cpp::anon_unknown_0::AccessorVerifier::SetTracker(pAVar1,pAVar4,uVar3)
  ;
  return;
}

Assistant:

ReturnType RemoteInvoker(
    TypeErasedState* const state,
    ForwardedParameterType<P>... args) noexcept(SigIsNoexcept) {
  using RawT = RemoveCVRef<QualTRef>;
  static_assert(!IsStoredLocally<RawT>::value,
                "Target object must be in remote storage in order to be "
                "invoked from it.");

  auto& f = *static_cast<RawT*>(state->remote.target);
  return (InvokeR<ReturnType>)(static_cast<QualTRef>(f),
                               static_cast<ForwardedParameterType<P>>(args)...);
}